

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall PhongShader::fragment(PhongShader *this,Model *model,vec3f bar,TGAColor *color)

{
  mat<3UL,_3UL> *this_00;
  double dVar1;
  TGAColor TVar2;
  vec<3UL,_double> *pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  vec<2UL,_double> vVar6;
  vec2f uv;
  uint8_t local_1a8 [4];
  uint8_t local_1a4;
  vec3f i;
  mat<3UL,_3UL> B;
  vec3f n;
  vec3f bn;
  vec3f local_f0;
  vec3f j;
  mat<3UL,_3UL> AI;
  mat<3UL,_3UL> A;
  
  operator*(A.rows,&this->varying_nrm,&bar);
  pvVar3 = vec<3UL,_double>::normalize(A.rows);
  bn.x = pvVar3->x;
  bn.y = pvVar3->y;
  bn.z = pvVar3->z;
  vVar6 = operator*(&this->varying_uv,&bar);
  uv.y = vVar6.y;
  uv.x = vVar6.x;
  A.rows[2].x = 0.0;
  A.rows[2].y = 0.0;
  A.rows[1].y = 0.0;
  A.rows[1].z = 0.0;
  A.rows[0].z = 0.0;
  A.rows[1].x = 0.0;
  A.rows[0].x = 0.0;
  A.rows[0].y = 0.0;
  A.rows[2].z = 0.0;
  this_00 = &this->ndc_tri;
  mat<3UL,_3UL>::col(AI.rows,this_00,1);
  mat<3UL,_3UL>::col(B.rows,this_00,0);
  operator-(A.rows,AI.rows,B.rows);
  mat<3UL,_3UL>::col(B.rows,this_00,2);
  mat<3UL,_3UL>::col(&i,this_00,0);
  operator-(AI.rows,B.rows,&i);
  A.rows[1].z = AI.rows[0].z;
  A.rows[1].x = AI.rows[0].x;
  A.rows[1].y = AI.rows[0].y;
  A.rows[2].x = bn.x;
  A.rows[2].y = bn.y;
  A.rows[2].z = bn.z;
  mat<3UL,_3UL>::invert(&AI,(mat<3UL,_3UL> *)A.rows);
  dVar1 = (this->varying_uv).rows[0].x;
  B.rows[0].x = (this->varying_uv).rows[0].y - dVar1;
  B.rows[0].y = (this->varying_uv).rows[0].z - dVar1;
  B.rows[0].z = 0.0;
  operator*(&i,&AI,B.rows);
  dVar1 = (this->varying_uv).rows[1].x;
  B.rows[0].x = (this->varying_uv).rows[1].y - dVar1;
  B.rows[0].y = (this->varying_uv).rows[1].z - dVar1;
  B.rows[0].z = 0.0;
  operator*(&j,&AI,B.rows);
  B.rows[2].x = 0.0;
  B.rows[2].y = 0.0;
  B.rows[1].y = 0.0;
  B.rows[1].z = 0.0;
  B.rows[0].z = 0.0;
  B.rows[1].x = 0.0;
  B.rows[0].x = 0.0;
  B.rows[0].y = 0.0;
  B.rows[2].z = 0.0;
  pvVar3 = vec<3UL,_double>::normalize(&i);
  mat<3UL,_3UL>::set_col(&B,0,pvVar3);
  pvVar3 = vec<3UL,_double>::normalize(&j);
  mat<3UL,_3UL>::set_col(&B,1,pvVar3);
  mat<3UL,_3UL>::set_col(&B,2,&bn);
  Model::normal(&local_f0,model,&uv);
  operator*((vec<3UL,_double> *)local_1a8,&B,&local_f0);
  pvVar3 = vec<3UL,_double>::normalize((vec<3UL,_double> *)local_1a8);
  n.x = pvVar3->x;
  n.y = pvVar3->y;
  n.z = pvVar3->z;
  dVar1 = dot<3ul,double>(&n,&light_dir);
  uVar4 = SUB84(dVar1,0);
  uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= 0.0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  TVar2 = Model::diffuse(model,&uv);
  local_1a8 = TVar2.bgra;
  local_1a4 = TVar2.bytespp;
  TVar2 = TGAColor::operator*((TGAColor *)local_1a8,(double)CONCAT44(uVar5,uVar4));
  *&color->bgra = TVar2.bgra;
  color->bytespp = TVar2.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f bn = (varying_nrm * bar).normalize();
        vec2f uv = varying_uv * bar;

        mat<3, 3> A;
        A[0] = ndc_tri.col(1) - ndc_tri.col(0);
        A[1] = ndc_tri.col(2) - ndc_tri.col(0);
        A[2] = bn;

        mat<3, 3> AI = A.invert();

        vec3f i =
            AI * vec3f(varying_uv[0][1] - varying_uv[0][0], varying_uv[0][2] - varying_uv[0][0], 0);
        vec3f j =
            AI * vec3f(varying_uv[1][1] - varying_uv[1][0], varying_uv[1][2] - varying_uv[1][0], 0);

        mat<3, 3> B;
        B.set_col(0, i.normalize());
        B.set_col(1, j.normalize());
        B.set_col(2, bn);

        vec3f n = (B * model.normal(uv)).normalize();

        double diff = std::max(0., dot(n, light_dir));
        color = model.diffuse(uv) * diff;

        return false;
    }